

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

Time __thiscall helics::apps::Source::runSourceLoop(Source *this,Time currentTime)

{
  _Elt_pointer pSVar1;
  Time TVar2;
  _Elt_pointer pSVar3;
  _Map_pointer ppSVar4;
  SourceObject *src;
  _Elt_pointer obj;
  Time TVar5;
  
  obj = (this->sources).
        super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur;
  pSVar1 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (currentTime.internalTimeCode < 0) {
    if (obj == pSVar1) {
      TVar5.internalTimeCode = 0;
    }
    else {
      pSVar3 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppSVar4 = (this->sources).
                super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      TVar5.internalTimeCode = 0;
      do {
        if ((obj->nextTime).internalTimeCode < 0) {
          runSource(this,obj,currentTime);
          (obj->nextTime).internalTimeCode = 0;
        }
        obj = obj + 1;
        if (obj == pSVar3) {
          obj = ppSVar4[1];
          ppSVar4 = ppSVar4 + 1;
          pSVar3 = obj + 2;
        }
      } while (obj != pSVar1);
    }
  }
  else {
    TVar5.internalTimeCode = 0x7fffffffffffffff;
    if (obj != pSVar1) {
      pSVar3 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppSVar4 = (this->sources).
                super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        TVar2 = runSource(this,obj,currentTime);
        if (TVar2.internalTimeCode < TVar5.internalTimeCode) {
          TVar5 = TVar2;
        }
        obj = obj + 1;
        if (obj == pSVar3) {
          obj = ppSVar4[1];
          ppSVar4 = ppSVar4 + 1;
          pSVar3 = obj + 2;
        }
      } while (obj != pSVar1);
    }
  }
  return (Time)TVar5.internalTimeCode;
}

Assistant:

Time Source::runSourceLoop(Time currentTime)
    {
        if (currentTime < timeZero) {
            for (auto& src : sources) {
                if (src.nextTime < timeZero) {
                    runSource(src, currentTime);
                    src.nextTime = timeZero;
                }
            }
            return timeZero;
        }
        Time minTime = Time::maxVal();
        for (auto& src : sources) {
            auto tm = runSource(src, currentTime);
            if (tm < minTime) {
                minTime = tm;
            }
        }
        return minTime;
    }